

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

bool __thiscall wallet::BerkeleyRODatabase::Backup(BerkeleyRODatabase *this,string *dest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string_view source_file;
  string_view source_file_00;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  _List _Var4;
  char cVar5;
  bool bVar6;
  Logger *pLVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  path dst;
  path src;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150 [2];
  long local_140 [2];
  undefined1 local_130 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_110;
  path local_108;
  path local_e0;
  undefined8 local_98;
  char *pcStack_90;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_108,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_e0,dest,auto_format);
  std::filesystem::__cxx11::path::path((path *)local_130,&local_e0);
  std::filesystem::__cxx11::path::~path(&local_e0);
  cVar5 = std::filesystem::status((path *)local_130);
  if (cVar5 == '\x02') {
    BDBDataFile((path *)&local_e0,(path *)local_130);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
               &local_e0._M_pathname);
    _Var4._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_e0._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    _Var3._M_head_impl = local_110._M_head_impl;
    local_e0._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    local_110._M_head_impl =
         (_Impl *)_Var4._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl;
    if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
         )_Var3._M_head_impl !=
        (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_110,(_Impl *)_Var3._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear(&local_e0);
    std::filesystem::__cxx11::path::~path(&local_e0);
  }
  cVar5 = std::filesystem::status((path *)local_130);
  if ((cVar5 != '\0') && (cVar5 != -1)) {
    cVar5 = std::filesystem::equivalent((path *)&local_108,(path *)local_130);
    if (cVar5 != '\0') {
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,local_130._0_8_,(pointer)(local_130._0_8_ + local_130._8_8_));
      pLVar7 = LogInstance();
      bVar6 = BCLog::Logger::Enabled(pLVar7);
      if (bVar6) {
        paVar1 = &local_e0._M_pathname.field_2;
        local_e0._M_pathname._M_string_length = 0;
        local_e0._M_pathname.field_2._M_local_buf[0] = '\0';
        local_e0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        tinyformat::format<std::__cxx11::string>
                  (&local_58,(tinyformat *)"cannot backup to wallet source file %s\n",
                   (char *)local_150,in_RCX);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_e0._M_pathname,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar7 = LogInstance();
        local_98 = 0x5b;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp"
        ;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp"
        ;
        source_file_00._M_len = 0x5b;
        str_00._M_str = local_e0._M_pathname._M_dataplus._M_p;
        str_00._M_len = local_e0._M_pathname._M_string_length;
        logging_function_00._M_str = "Backup";
        logging_function_00._M_len = 6;
        BCLog::Logger::LogPrintStr(pLVar7,str_00,logging_function_00,source_file_00,0x2cd,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_pathname._M_dataplus._M_p,
                          CONCAT71(local_e0._M_pathname.field_2._M_allocated_capacity._1_7_,
                                   local_e0._M_pathname.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      bVar6 = false;
      goto LAB_001e735f;
    }
  }
  std::filesystem::copy_file((path *)&local_108,(path *)local_130,overwrite_existing);
  pcVar2 = (this->m_filepath).super_path._M_pathname._M_dataplus._M_p;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,pcVar2,
             pcVar2 + (this->m_filepath).super_path._M_pathname._M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_130._0_8_,(pointer)(local_130._0_8_ + local_130._8_8_));
  pLVar7 = LogInstance();
  bVar6 = BCLog::Logger::Enabled(pLVar7);
  if (bVar6) {
    paVar1 = &local_e0._M_pathname.field_2;
    local_e0._M_pathname._M_string_length = 0;
    local_e0._M_pathname.field_2._M_local_buf[0] = '\0';
    local_e0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_58,(tinyformat *)"copied %s to %s\n",(char *)local_150,&local_170,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_e0._M_pathname,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pLVar7 = LogInstance();
    local_98 = 0x5b;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp"
    ;
    source_file._M_len = 0x5b;
    str._M_str = local_e0._M_pathname._M_dataplus._M_p;
    str._M_len = local_e0._M_pathname._M_string_length;
    logging_function._M_str = "Backup";
    logging_function._M_len = 6;
    BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x2d2,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_e0._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_e0._M_pathname.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  bVar6 = true;
LAB_001e735f:
  std::filesystem::__cxx11::path::~path((path *)local_130);
  std::filesystem::__cxx11::path::~path(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyRODatabase::Backup(const std::string& dest) const
{
    fs::path src(m_filepath);
    fs::path dst(fs::PathFromString(dest));

    if (fs::is_directory(dst)) {
        dst = BDBDataFile(dst);
    }
    try {
        if (fs::exists(dst) && fs::equivalent(src, dst)) {
            LogPrintf("cannot backup to wallet source file %s\n", fs::PathToString(dst));
            return false;
        }

        fs::copy_file(src, dst, fs::copy_options::overwrite_existing);
        LogPrintf("copied %s to %s\n", fs::PathToString(m_filepath), fs::PathToString(dst));
        return true;
    } catch (const fs::filesystem_error& e) {
        LogPrintf("error copying %s to %s - %s\n", fs::PathToString(m_filepath), fs::PathToString(dst), fsbridge::get_filesystem_error_message(e));
        return false;
    }
}